

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_long,unsigned_long,long,long>
               (ostream *out,char *fmt,unsigned_long *args,unsigned_long *args_1,long *args_2,
               long *args_3)

{
  ostream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff38;
  unsigned_long local_78 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<unsigned_long,unsigned_long,long,long>
            (local_78,(unsigned_long *)in_RSI,in_RDI,(long *)in_stack_ffffffffffffff38);
  vformat(in_RSI,(char *)in_RDI,in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}